

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(GLMClassifier *a,GLMClassifier *b)

{
  code *pcVar1;
  bool bVar2;
  GLMClassifier_PostEvaluationTransform GVar3;
  GLMClassifier_PostEvaluationTransform GVar4;
  GLMClassifier_ClassEncoding GVar5;
  GLMClassifier_ClassEncoding GVar6;
  ClassLabelsCase CVar7;
  ClassLabelsCase CVar8;
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> *a_00;
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> *b_00;
  RepeatedField<double> *a_01;
  RepeatedField<double> *b_01;
  Int64Vector *a_02;
  Int64Vector *b_02;
  StringVector *a_03;
  StringVector *b_03;
  GLMClassifier *b_local;
  GLMClassifier *a_local;
  
  a_00 = GLMClassifier::weights(a);
  b_00 = GLMClassifier::weights(b);
  bVar2 = operator!=(a_00,b_00);
  if (bVar2) {
    a_local._7_1_ = false;
  }
  else {
    a_01 = GLMClassifier::offset(a);
    b_01 = GLMClassifier::offset(b);
    bVar2 = operator!=(a_01,b_01);
    if (bVar2) {
      a_local._7_1_ = false;
    }
    else {
      GVar3 = GLMClassifier::postevaluationtransform(a);
      GVar4 = GLMClassifier::postevaluationtransform(b);
      if (GVar3 == GVar4) {
        GVar5 = GLMClassifier::classencoding(a);
        GVar6 = GLMClassifier::classencoding(b);
        if (GVar5 == GVar6) {
          CVar7 = GLMClassifier::ClassLabels_case(a);
          CVar8 = GLMClassifier::ClassLabels_case(b);
          if (CVar7 == CVar8) {
            CVar7 = GLMClassifier::ClassLabels_case(a);
            if (CVar7 == CLASSLABELS_NOT_SET) {
              a_local._7_1_ = true;
            }
            else if (CVar7 == kStringClassLabels) {
              a_03 = GLMClassifier::stringclasslabels(a);
              b_03 = GLMClassifier::stringclasslabels(b);
              a_local._7_1_ = operator==(a_03,b_03);
            }
            else {
              if (CVar7 != kInt64ClassLabels) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              a_02 = GLMClassifier::int64classlabels(a);
              b_02 = GLMClassifier::int64classlabels(b);
              a_local._7_1_ = operator==(a_02,b_02);
            }
          }
          else {
            a_local._7_1_ = false;
          }
        }
        else {
          a_local._7_1_ = false;
        }
      }
      else {
        a_local._7_1_ = false;
      }
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const GLMClassifier& a,
                        const GLMClassifier& b) {
            if (a.weights() != b.weights()) {
                return false;
            }
            if (a.offset() != b.offset()) {
                return false;
            }
            if (a.postevaluationtransform() != b.postevaluationtransform()) {
                return false;
            }
            if (a.classencoding() != b.classencoding()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case GLMClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case GLMClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case GLMClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }